

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O2

int sndio_enumerate_devices
              (cubeb_conflict2 *context,cubeb_device_type type,cubeb_device_collection *collection)

{
  uint32_t uVar1;
  int iVar2;
  cubeb_device_info *pcVar3;
  
  pcVar3 = (cubeb_device_info *)malloc(0x58);
  if (pcVar3 == (cubeb_device_info *)0x0) {
    iVar2 = -1;
  }
  else {
    pcVar3->devid = sndio_enumerate_devices::dev;
    pcVar3->device_id = sndio_enumerate_devices::dev;
    pcVar3->friendly_name = sndio_enumerate_devices::dev;
    pcVar3->group_id = sndio_enumerate_devices::dev;
    pcVar3->vendor_name = (char *)0x0;
    pcVar3->type = type;
    uVar1 = 8;
    if (type == CUBEB_DEVICE_TYPE_INPUT) {
      uVar1 = 2;
    }
    pcVar3->state = CUBEB_DEVICE_STATE_ENABLED;
    pcVar3->preferred = CUBEB_DEVICE_PREF_ALL;
    pcVar3->format = CUBEB_DEVICE_FMT_S16LE;
    pcVar3->default_format = CUBEB_DEVICE_FMT_S16LE;
    pcVar3->max_channels = uVar1;
    pcVar3->default_rate = 48000;
    pcVar3->max_rate = 0x2ee00;
    pcVar3->min_rate = 4000;
    pcVar3->latency_lo = 0x1e0;
    pcVar3->latency_hi = 0x2580;
    collection->device = pcVar3;
    collection->count = 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
sndio_enumerate_devices(cubeb * context, cubeb_device_type type,
                        cubeb_device_collection * collection)
{
  static char dev[] = SIO_DEVANY;
  cubeb_device_info * device;

  device = malloc(sizeof(cubeb_device_info));
  if (device == NULL)
    return CUBEB_ERROR;

  device->devid = dev;         /* passed to stream_init() */
  device->device_id = dev;     /* printable in UI */
  device->friendly_name = dev; /* same, but friendly */
  device->group_id = dev;      /* actual device if full-duplex */
  device->vendor_name = NULL;  /* may be NULL */
  device->type = type;         /* Input/Output */
  device->state = CUBEB_DEVICE_STATE_ENABLED;
  device->preferred = CUBEB_DEVICE_PREF_ALL;
  device->format = CUBEB_DEVICE_FMT_S16NE;
  device->default_format = CUBEB_DEVICE_FMT_S16NE;
  device->max_channels = (type == CUBEB_DEVICE_TYPE_INPUT) ? 2 : 8;
  device->default_rate = 48000;
  device->min_rate = 4000;
  device->max_rate = 192000;
  device->latency_lo = 480;
  device->latency_hi = 9600;
  collection->device = device;
  collection->count = 1;
  return CUBEB_OK;
}